

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundex.cpp
# Opt level: O2

string * Soundex::encode(string *__return_storage_ptr__,string *word)

{
  string encoded;
  string local_30;
  
  encodeString(&local_30,word);
  resize(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string Soundex::encode(const string &word) {
    string encoded = encodeString(word);
    return resize(encoded);
}